

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

void __thiscall cfd::capi::CfdCapiManager::FreeHandle(CfdCapiManager *this,void *handle)

{
  CfdCapiHandleData *pCVar1;
  bool bVar2;
  int iVar3;
  string *message;
  reference ppCVar4;
  CfdCapiHandleData *in_RSI;
  CfdException *in_RDI;
  iterator ite;
  lock_guard<std::mutex> lock;
  size_t len;
  CfdCapiHandleData *handle_data;
  mutex_type *in_stack_ffffffffffffff18;
  CfdSourceLocation *in_stack_ffffffffffffff20;
  vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
  *in_stack_ffffffffffffff30;
  const_iterator in_stack_ffffffffffffff38;
  allocator *paVar5;
  __normal_iterator<cfd::capi::CfdCapiHandleData_**,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
  local_80 [2];
  undefined1 local_6d;
  allocator local_59;
  string local_58 [32];
  CfdSourceLocation local_38;
  undefined8 local_20;
  CfdCapiHandleData *local_18;
  CfdCapiHandleData *local_10;
  
  if (in_RSI != (CfdCapiHandleData *)0x0) {
    local_20 = 0xf;
    local_18 = in_RSI;
    local_10 = in_RSI;
    iVar3 = memcmp(in_RSI,"CapiHandleData",0xf);
    if (iVar3 != 0) {
      local_38.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_common.cpp"
                   ,0x2f);
      local_38.filename = local_38.filename + 1;
      local_38.line = 0x164;
      local_38.funcname = "FreeHandle";
      core::logger::warn<>(&local_38,"Illegal handle data. prefix unmatch.");
      local_6d = 1;
      message = (string *)__cxa_allocate_exception(0x30);
      paVar5 = &local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"Illegal handle data.",paVar5);
      core::CfdException::CfdException(in_RDI,(CfdError)((ulong)paVar5 >> 0x20),message);
      local_6d = 0;
      __cxa_throw(message,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if ((local_18->is_outside & 1U) == 0) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      __gnu_cxx::
      __normal_iterator<cfd::capi::CfdCapiHandleData_**,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
      ::__normal_iterator(local_80);
      local_80[0]._M_current =
           (CfdCapiHandleData **)
           std::
           vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>::
           begin((vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
                  *)in_stack_ffffffffffffff18);
      while( true ) {
        std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
        ::end((vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
               *)in_stack_ffffffffffffff18);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<cfd::capi::CfdCapiHandleData_**,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
                            *)in_stack_ffffffffffffff20,
                           (__normal_iterator<cfd::capi::CfdCapiHandleData_**,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
                            *)in_stack_ffffffffffffff18);
        pCVar1 = local_10;
        if (!bVar2) break;
        ppCVar4 = __gnu_cxx::
                  __normal_iterator<cfd::capi::CfdCapiHandleData_**,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
                  ::operator*(local_80);
        if (pCVar1 == *ppCVar4) {
          strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_common.cpp"
                  ,0x2f);
          core::logger::info<void*&>
                    (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,(void **)0x576687);
          memset(local_10,0,0x118);
          free(local_10);
          __gnu_cxx::
          __normal_iterator<cfd::capi::CfdCapiHandleData*const*,std::vector<cfd::capi::CfdCapiHandleData*,std::allocator<cfd::capi::CfdCapiHandleData*>>>
          ::__normal_iterator<cfd::capi::CfdCapiHandleData**>
                    ((__normal_iterator<cfd::capi::CfdCapiHandleData_*const_*,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
                      *)in_stack_ffffffffffffff20,
                     (__normal_iterator<cfd::capi::CfdCapiHandleData_**,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
                      *)&in_RDI->error_code_);
          std::
          vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>::
          erase(in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
          break;
        }
        __gnu_cxx::
        __normal_iterator<cfd::capi::CfdCapiHandleData_**,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
        ::operator++(local_80);
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x57671f);
    }
    else {
      memset(local_10,0,0x118);
      free(local_10);
    }
  }
  return;
}

Assistant:

void CfdCapiManager::FreeHandle(void* handle) {
  if (handle != nullptr) {
    CfdCapiHandleData* handle_data = static_cast<CfdCapiHandleData*>(handle);
    size_t len = strlen(kPrefixHandleData) + 1;
    if (memcmp(handle_data->prefix, kPrefixHandleData, len) != 0) {
      warn(CFD_LOG_SOURCE, "Illegal handle data. prefix unmatch.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Illegal handle data.");
    }

    if (handle_data->is_outside) {  // outside handle
      memset(handle, 0, sizeof(CfdCapiHandleData));
      ::free(handle);
    } else {
      // 排他制御開始
      std::lock_guard<std::mutex> lock(mutex_);

      std::vector<CfdCapiHandleData*>::iterator ite;
      for (ite = handle_list_.begin(); ite != handle_list_.end(); ++ite) {
        if (handle == *ite) {
          info(CFD_LOG_SOURCE, "capi FreeHandle. addr={:p}.", handle);
          memset(handle, 0, sizeof(CfdCapiHandleData));
          ::free(handle);
          handle_list_.erase(ite);
          break;
        }
      }
    }
  }
}